

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

bool __thiscall gl3cts::TransformFeedback::Limits::test_max_transform_feedback_buffers(Limits *this)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  GLint max_transform_feedback_buffers;
  int local_1a4;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  local_1a4 = 0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(0x8e70,&local_1a4);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glGetIntegerv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x8eb);
  iVar1 = local_1a4;
  if (local_1a4 < 4) {
    local_1a0._0_8_ = this->m_context->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"MAX_TRANSFORM_FEEDBACK_BUFFERS is equal to ",0x2b);
    std::ostream::operator<<(this_00,local_1a4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," which is less than expected ",0x1d);
    std::ostream::operator<<(this_00,4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_128);
  }
  return 3 < iVar1;
}

Assistant:

bool gl3cts::TransformFeedback::Limits::test_max_transform_feedback_buffers(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check that MAX_TRANSFORM_FEEDBACK_BUFFERS is at least 4. */
	glw::GLint max_transform_feedback_buffers = 0;

	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_BUFFERS, &max_transform_feedback_buffers);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

	if (max_transform_feedback_buffers < s_min_value_of_max_transform_feedback_buffers)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "MAX_TRANSFORM_FEEDBACK_BUFFERS is equal to "
											<< max_transform_feedback_buffers << " which is less than expected "
											<< s_min_value_of_max_transform_feedback_buffers << "."
											<< tcu::TestLog::EndMessage;
		return false;
	}

	return true;
}